

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O3

void __thiscall
SplitStringTest_single_word_long_Test<signed_char>::TestBody
          (SplitStringTest_single_word_long_Test<signed_char> *this)

{
  char *pcVar1;
  vector<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
  split_result;
  basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_> delim;
  basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_> single_word
  ;
  int local_80 [2];
  long *local_78;
  internal local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  container_type local_60;
  basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_> local_48;
  basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_> local_28;
  
  make_word<signed_char,std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>>
            (&local_28,8,'\0');
  make_delim_long<signed_char,std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>>
            (&local_48,8,'\0');
  jessilib::
  split<std::vector,___gnu_cxx::__normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
            (&local_60,
             (__normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
              )local_28._M_dataplus._M_p,
             (__normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
              )(local_28._M_dataplus._M_p + local_28._M_string_length),
             (__normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
              )local_48._M_dataplus._M_p,
             (__normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
              )(local_48._M_dataplus._M_p + local_48._M_string_length));
  local_78 = (long *)((long)local_60.
                            super__Vector_base<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_60.
                            super__Vector_base<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5);
  local_80[0] = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_70,"split_result.size()","1",(unsigned_long *)&local_78,local_80);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
               ,0xdb,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
    if (local_78 != (long *)0x0) {
      (**(code **)(*local_78 + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_78 = (long *)(local_60.
                      super__Vector_base<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
  local_80[0] = 8;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_70,"split_result[0].size()","8",(unsigned_long *)&local_78,local_80);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
               ,0xdc,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
    if (local_78 != (long *)0x0) {
      (**(code **)(*local_78 + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  std::
  vector<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
  ::~vector(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TYPED_TEST(SplitStringTest, single_word_long) {
	std::basic_string<TypeParam> single_word = make_word<TypeParam>();
	auto delim = make_delim_long<TypeParam>(8);
	std::vector<decltype(single_word)> split_result = split(single_word, delim);
	EXPECT_EQ(split_result.size(), 1);
	EXPECT_EQ(split_result[0].size(), 8);
}